

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

void ma_pcm_rb_uninit(ma_pcm_rb *pRB)

{
  if (pRB != (ma_pcm_rb *)0x0) {
    ma_rb_uninit(&pRB->rb);
    return;
  }
  return;
}

Assistant:

MA_API void ma_pcm_rb_uninit(ma_pcm_rb* pRB)
{
    if (pRB == NULL) {
        return;
    }

    ma_data_source_uninit(&pRB->ds);
    ma_rb_uninit(&pRB->rb);
}